

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O1

set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
* dgrminer::enumerate(set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                      *__return_storage_ptr__,
                     vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                     *adjacency_lists,vector<int,_std::allocator<int>_> *graph_ids,
                     vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     *pattern_edge_list,
                     vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *nodes_occupied_by_antecedent,
                     vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *edges_occupied_by_antecedent,bool new_measures,
                     unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     *multiple_pattern_occurrences,
                     unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     *multiple_antecedent_occurrences)

{
  _Rb_tree_header *p_Var1;
  ulong *puVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer paVar7;
  int *piVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  int *piVar13;
  _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
  *p_Var14;
  iterator iVar15;
  _Elt_pointer piVar16;
  pointer piVar17;
  long lVar18;
  ulong uVar19;
  int *piVar20;
  ulong uVar21;
  _Elt_pointer piVar22;
  ulong uVar23;
  pointer paVar24;
  size_t i;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pvVar30;
  bool bVar31;
  bool bVar32;
  int g_id;
  int local_338;
  int local_334;
  _Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
  *local_330;
  ulong local_328;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_320;
  long local_318;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adj_list;
  vector<int,_std::allocator<int>_> real_ids_dst;
  vector<int,_std::allocator<int>_> real_ids_src;
  int n_1;
  int iStack_2a4;
  _Rb_tree_node_base _Stack_2a0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_280;
  _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_250;
  vector<int,_std::allocator<int>_> real_ids_dst_ind;
  vector<int,_std::allocator<int>_> right_most_path_occurrence;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adj_edge_info;
  vector<int,_std::allocator<int>_> real_ids_src_ind;
  vector<int,_std::allocator<int>_> sequence_of_edge_indices;
  size_type local_178;
  int n_1_1;
  undefined4 uStack_144;
  pointer local_140;
  deque<int,_std::allocator<int>_> right_most_path;
  set<int,_std::less<int>,_std::allocator<int>_> pattern_occurrence_vertexes;
  vector<int,_std::allocator<int>_> sequence_of_nodes;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> edge_candidates_1;
  vector<int,_std::allocator<int>_> real_second_edge_ids;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  find_rightmost_path(&right_most_path,pattern_edge_list);
  paVar7 = (pattern_edge_list->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar18 = (long)(pattern_edge_list->
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar7;
  if (lVar18 == 0) {
    local_178 = 1;
  }
  else {
    lVar18 = (lVar18 >> 3) * -0x3333333333333333;
    lVar18 = lVar18 + (ulong)(lVar18 == 0);
    piVar13 = paVar7->_M_elems + 1;
    iVar29 = 0;
    do {
      iVar4 = *piVar13;
      if (*piVar13 < iVar29) {
        iVar4 = iVar29;
      }
      iVar29 = iVar4;
      piVar13 = piVar13 + 10;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
    local_178 = (size_type)(iVar29 + 1);
  }
  local_320 = pattern_edge_list;
  if ((adjacency_lists->
      super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (adjacency_lists->
      super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar25 = 0;
    do {
      _Stack_2a0._M_parent = (_Base_ptr)0x0;
      _n_1 = 0;
      _Stack_2a0._M_color = _S_red;
      _Stack_2a0._4_4_ = 0;
      _Stack_280._M_impl._0_8_ = 0;
      _Stack_2a0._M_left = &_Stack_2a0;
      _Stack_2a0._M_right = &_Stack_2a0;
      std::
      vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
      ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
                ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                  *)nodes_occupied_by_antecedent,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &n_1);
      _Stack_2a0._M_parent = (_Base_ptr)0x0;
      _n_1 = 0;
      _Stack_2a0._0_8_ = 0;
      _Stack_280._M_impl._0_8_ = 0;
      _Stack_2a0._M_left = &_Stack_2a0;
      _Stack_2a0._M_right = &_Stack_2a0;
      std::
      vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
      ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
                ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                  *)edges_occupied_by_antecedent,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &n_1);
      uVar25 = uVar25 + 1;
      uVar12 = ((long)(adjacency_lists->
                      super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(adjacency_lists->
                      super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    } while (uVar25 <= uVar12 && uVar12 - uVar25 != 0);
  }
  piVar13 = (graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar8 = (graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar13 != piVar8) {
    pvVar30 = local_320;
    local_330 = (_Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                 *)__return_storage_ptr__;
    do {
      g_id = *piVar13;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&adj_list,
               &(adjacency_lists->
                super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                )._M_impl.super__Vector_impl_data._M_start[g_id].adjacencyList);
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::vector(&adj_edge_info,
               &(adjacency_lists->
                super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                )._M_impl.super__Vector_impl_data._M_start[g_id].adjacencyEdgeInfo);
      _n_1 = _n_1 & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&real_ids_src,
                 ((long)(pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&n_1,
                 (allocator_type *)&pattern_occurrence_vertexes);
      _n_1 = _n_1 & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&real_ids_dst,
                 ((long)(pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&n_1,
                 (allocator_type *)&pattern_occurrence_vertexes);
      _n_1 = _n_1 & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&real_ids_dst_ind,
                 ((long)(pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&n_1,
                 (allocator_type *)&pattern_occurrence_vertexes);
      _n_1 = _n_1 & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&real_ids_src_ind,
                 ((long)(pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&n_1,
                 (allocator_type *)&pattern_occurrence_vertexes);
      __return_storage_ptr__ =
           (set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
            *)local_330;
      if (adj_list.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          adj_list.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar25 = 0;
        do {
          if (adj_list.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar25].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              adj_list.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar25].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             ) {
            uVar12 = 0;
            do {
              bVar9 = is_adj_info_equal_to_pattern_edge
                                (adj_edge_info.
                                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar12,
                                 (pvVar30->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start,true);
              if (bVar9) {
                *real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar25;
                *real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start =
                     adj_list.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar25].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar12];
                *real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar12;
                piVar17 = adj_list.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [*real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (adj_list.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish != piVar17) {
                  lVar18 = 0;
                  uVar26 = 0;
                  do {
                    if (uVar25 == (long)piVar17[uVar26]) {
                      flipAdjacencyInfo((array<int,_8UL> *)
                                        ((long)(adj_edge_info.
                                                super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [*real_ids_dst.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start].
                                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems
                                        + lVar18));
                      bVar9 = is_adj_info_equal_to_pattern_edge
                                        ((array<int,_8UL> *)&n_1,
                                         (pvVar30->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start,true);
                      __return_storage_ptr__ =
                           (set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                            *)local_330;
                      if (bVar9) {
                        *real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start = (int)uVar26;
                        break;
                      }
                    }
                    uVar26 = uVar26 + 1;
                    piVar17 = adj_list.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [*real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    lVar18 = lVar18 + 0x20;
                  } while (uVar26 < (ulong)((long)adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [*real_ids_dst.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar17 >> 2));
                }
                _n_1 = _n_1 & 0xffffffff00000000;
                std::vector<int,_std::allocator<int>_>::vector
                          (&sequence_of_nodes,local_178,&n_1,
                           (allocator_type *)&pattern_occurrence_vertexes);
                *sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar25;
                sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1] =
                     adj_list.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar25].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar12];
                _n_1 = _n_1 & 0xffffffff00000000;
                std::vector<int,_std::allocator<int>_>::vector
                          (&sequence_of_edge_indices,
                           ((long)(pvVar30->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar30->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333,&n_1,(allocator_type *)&pattern_occurrence_vertexes);
                *sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar12;
                iVar29 = 1;
LAB_00141c46:
                uVar19 = (ulong)iVar29;
                uVar26 = ((long)(pvVar30->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar30->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x3333333333333333;
                if (uVar26 < uVar19 || uVar26 - uVar19 == 0) {
                  local_338 = iVar29;
                  local_328 = uVar19;
                  if ((pvVar30->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish !=
                      (pvVar30->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
                    lVar18 = 0;
                    uVar26 = 0;
                    do {
                      _n_1 = CONCAT44(iStack_2a4,
                                      *(undefined4 *)
                                       ((long)real_ids_src.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + lVar18));
                      iVar29 = *(int *)((long)real_ids_dst_ind.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + lVar18);
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_insert_unique<int_const&>
                                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                  *)((nodes_occupied_by_antecedent->
                                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + g_id),&n_1);
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_insert_unique<int_const&>
                                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                  *)((nodes_occupied_by_antecedent->
                                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + g_id),
                                 (int *)((long)real_ids_dst.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + lVar18));
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_insert_unique<int_const&>
                                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                  *)((edges_occupied_by_antecedent->
                                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + g_id),
                                 adj_edge_info.
                                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[n_1].
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar29]._M_elems + 7);
                      uVar26 = uVar26 + 1;
                      uVar19 = ((long)(local_320->
                                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_320->
                                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x3333333333333333;
                      lVar18 = lVar18 + 4;
                      pvVar30 = local_320;
                    } while (uVar26 <= uVar19 && uVar19 - uVar26 != 0);
                  }
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                       = _S_red;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                       = (_Base_ptr)0x0;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                       = pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
                  if (new_measures) {
                    _Stack_2a0._0_8_ = _Stack_2a0._0_8_ & 0xffffffff00000000;
                    _Stack_2a0._M_parent = (_Base_ptr)0x0;
                    _Stack_2a0._M_left = &_Stack_2a0;
                    _Stack_280._M_impl._0_8_ = 0;
                    _Stack_2a0._M_right = _Stack_2a0._M_left;
                    if ((pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish !=
                        (pvVar30->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) {
                      lVar27 = 0;
                      lVar18 = 0;
                      uVar26 = 0;
                      do {
                        n_1_1 = *(int *)((long)real_ids_src.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + lVar27);
                        std::
                        _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                        _M_insert_unique<int_const&>
                                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                    *)&pattern_occurrence_vertexes,&n_1_1);
                        std::
                        _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                        _M_insert_unique<int_const&>
                                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                    *)&pattern_occurrence_vertexes,
                                   (int *)((long)real_ids_dst.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar27))
                        ;
                        if (*(int *)((long)((pvVar30->
                                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                    lVar18 + 0xc) != 0) {
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&n_1,&n_1_1);
                        }
                        if (*(int *)((long)((pvVar30->
                                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                    lVar18 + 0x20) != 0) {
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&n_1,(int *)((long)real_ids_dst.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar27)
                                    );
                        }
                        uVar26 = uVar26 + 1;
                        uVar19 = ((long)(pvVar30->
                                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar30->
                                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x3333333333333333;
                        lVar18 = lVar18 + 0x28;
                        lVar27 = lVar27 + 4;
                      } while (uVar26 <= uVar19 && uVar19 - uVar26 != 0);
                    }
                    p_Var14 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                               *)std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)multiple_pattern_occurrences,&g_id);
                    std::
                    _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                              (p_Var14,&pattern_occurrence_vertexes);
                    p_Var14 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                               *)std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)multiple_antecedent_occurrences,&g_id);
                    std::
                    _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                              (p_Var14,(set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
                    std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                               *)&n_1);
                  }
                  right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  lVar18 = 0;
                  for (uVar26 = 0;
                      uVar19 = ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_last -
                                (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
                               ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_finish._M_cur -
                                (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                               ((((ulong)((long)right_most_path.
                                                super__Deque_base<int,_std::allocator<int>_>._M_impl
                                                .super__Deque_impl_data._M_finish._M_node -
                                         (long)right_most_path.
                                               super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                               super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                               (ulong)(right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Deque_impl_data._M_finish._M_node ==
                                      (_Map_pointer)0x0)) * 0x80, uVar26 < uVar19;
                      uVar26 = uVar26 + 1) {
                    lVar27 = (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_cur -
                             (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_first >> 2;
                    uVar19 = uVar26 + lVar27;
                    if (uVar19 < 0x80) {
                      piVar20 = (int *)((long)right_most_path.
                                              super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                              super__Deque_impl_data._M_start._M_cur + lVar18);
                    }
                    else {
                      uVar21 = uVar19 >> 7 | 0xfe00000000000000;
                      if (0 < (long)uVar19) {
                        uVar21 = uVar19 >> 7;
                      }
                      piVar20 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl
                                .super__Deque_impl_data._M_start._M_node[uVar21] +
                                lVar27 + uVar21 * -0x80 + uVar26;
                    }
                    if (right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&right_most_path_occurrence,
                                 (iterator)
                                 right_most_path_occurrence.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,
                                 sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + *piVar20);
                    }
                    else {
                      *right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[*piVar20];
                      right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    lVar18 = lVar18 + 4;
                  }
                  piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_cur;
                  if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur ==
                      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first) {
                    piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                  }
                  paVar7 = (pvVar30->
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                  iVar29 = paVar7[-1]._M_elems[0];
                  if ((piVar16[-1] == iVar29) && (iVar4 = paVar7[-1]._M_elems[1], iVar4 < iVar29)) {
                    uVar26 = 0;
                    if (uVar19 != 0) {
                      lVar18 = (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Deque_impl_data._M_start._M_cur -
                               (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Deque_impl_data._M_start._M_first;
                      lVar27 = lVar18 >> 2;
                      lVar28 = 0;
                      uVar26 = 0;
                      do {
                        uVar21 = lVar27 + uVar26;
                        if (uVar21 < 0x80) {
                          piVar20 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_cur + uVar26;
                        }
                        else {
                          uVar23 = uVar21 >> 7 | 0xfe00000000000000;
                          if (0 < (long)uVar21) {
                            uVar23 = uVar21 >> 7;
                          }
                          piVar20 = (int *)((long)right_most_path.
                                                  super__Deque_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Deque_impl_data._M_start._M_node
                                                  [uVar23] + lVar18 + uVar23 * -0x200);
                          pvVar30 = local_320;
                        }
                        if (*piVar20 == iVar4) {
                          uVar26 = lVar28 >> 0x20;
                          goto LAB_001420ad;
                        }
                        uVar26 = uVar26 + 1;
                        lVar28 = lVar28 + 0x100000000;
                        lVar18 = lVar18 + 4;
                      } while (uVar26 < uVar19);
                      goto LAB_001420aa;
                    }
                  }
                  else {
LAB_001420aa:
                    uVar26 = 0;
                  }
LAB_001420ad:
                  local_334 = right_most_path_occurrence.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish[-1];
                  while( true ) {
                    lVar18 = ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_cur -
                              (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                             ((((ulong)((long)right_most_path.
                                              super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                              super__Deque_impl_data._M_finish._M_node -
                                       (long)right_most_path.
                                             super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                             super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                             (ulong)(right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Deque_impl_data._M_finish._M_node ==
                                    (_Map_pointer)0x0)) * 0x80;
                    lVar27 = (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_last -
                             (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_cur >> 2;
                    if ((lVar27 + lVar18) - 1U <= uVar26) break;
                    find_backward_edge_candidates
                              ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                *)&n_1_1,&adj_list,&adj_edge_info,local_334,
                               right_most_path_occurrence.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar26],&real_ids_src,&real_ids_dst,
                               &real_ids_dst_ind);
                    paVar24 = (pointer)CONCAT44(uStack_144,n_1_1);
                    if (local_140 != paVar24) {
                      lVar18 = 0x1c;
                      uVar19 = 0;
                      do {
                        piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
                        if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_cur ==
                            right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_first) {
                          piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                        }
                        uVar21 = ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur -
                                  (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                                 uVar26;
                        if (uVar21 < 0x80) {
                          piVar22 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_cur + uVar26;
                        }
                        else {
                          uVar23 = uVar21 >> 7 | 0xfe00000000000000;
                          if (0 < (long)uVar21) {
                            uVar23 = uVar21 >> 7;
                          }
                          piVar22 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar23] +
                                    uVar21 + uVar23 * -0x80;
                        }
                        puVar2 = (ulong *)((long)paVar24->_M_elems + lVar18 + -0x1c);
                        _Stack_2a0._0_8_ = *puVar2;
                        _Stack_2a0._M_parent = (_Base_ptr)puVar2[1];
                        plVar3 = (long *)((long)paVar24->_M_elems + lVar18 + -0xc);
                        _Stack_2a0._M_left = (_Base_ptr)*plVar3;
                        _Stack_2a0._M_right = (_Base_ptr)plVar3[1];
                        _Stack_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                        _Stack_280._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)0x0;
                        _Stack_280._M_impl.super__Rb_tree_header._M_header._M_left =
                             &_Stack_280._M_impl.super__Rb_tree_header._M_header;
                        _Stack_280._M_impl.super__Rb_tree_header._M_node_count = 0;
                        local_250._M_bucket_count = 1;
                        local_250._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                        local_250._M_element_count = 0;
                        local_250._M_rehash_policy._M_max_load_factor = 1.0;
                        local_250._M_rehash_policy._M_next_resize = 0;
                        local_250._M_single_bucket = (__node_base_ptr)0x0;
                        _n_1 = CONCAT44(*piVar22,piVar16[-1]);
                        _Stack_280._M_impl.super__Rb_tree_header._M_header._M_right =
                             _Stack_280._M_impl.super__Rb_tree_header._M_header._M_left;
                        local_250._M_buckets = &local_250._M_single_bucket;
                        iVar15 = std::
                                 _Rb_tree<dgrminer::children_candidate,_dgrminer::children_candidate,_std::_Identity<dgrminer::children_candidate>,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                                 ::find(&__return_storage_ptr__->_M_t,(key_type *)&n_1);
                        if ((_Rb_tree_header *)iVar15._M_node == p_Var1) {
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&_Stack_280,&g_id);
                          if (new_measures) {
                            p_Var14 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                       *)std::__detail::
                                         _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         ::operator[]((
                                                  _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&local_250,&g_id);
                            std::
                            _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                            ::
                            _M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                                      (p_Var14,&pattern_occurrence_vertexes);
                          }
                          std::
                          _Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                          ::_M_insert_unique<dgrminer::children_candidate_const&>
                                    ((_Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                                      *)__return_storage_ptr__,(children_candidate *)&n_1);
                        }
                        else {
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&iVar15._M_node[2]._M_parent,&g_id);
                          if (new_measures) {
                            p_Var14 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                       *)std::__detail::
                                         _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         ::operator[]((
                                                  _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&iVar15._M_node[3]._M_right,&g_id);
                            std::
                            _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                            ::
                            _M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                                      (p_Var14,&pattern_occurrence_vertexes);
                          }
                        }
                        std::
                        _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::~_Hashtable(&local_250);
                        std::
                        _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        ::~_Rb_tree(&_Stack_280);
                        uVar19 = uVar19 + 1;
                        paVar24 = (pointer)CONCAT44(uStack_144,n_1_1);
                        lVar18 = lVar18 + 0x20;
                      } while (uVar19 < (ulong)((long)local_140 - (long)paVar24 >> 5));
                    }
                    if (paVar24 != (pointer)0x0) {
                      operator_delete(paVar24);
                    }
                    uVar26 = uVar26 + 1;
                  }
                  uVar11 = ((int)lVar18 + (int)lVar27) - 1;
                  if (-1 < (int)uVar11) {
                    uVar26 = (ulong)uVar11;
                    do {
                      real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      find_forward_edge_candidates
                                (&edge_candidates_1,&adj_list,&adj_edge_info,
                                 right_most_path_occurrence.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar26],&sequence_of_nodes,
                                 &real_second_edge_ids);
                      if (edge_candidates_1.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          edge_candidates_1.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        lVar18 = 0;
                        uVar19 = 0;
                        do {
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                      *)&n_1_1,&pattern_occurrence_vertexes._M_t);
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&n_1_1,
                                     right_most_path_occurrence.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + uVar26);
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&n_1_1,
                                     (int *)((long)real_second_edge_ids.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start + lVar18
                                            ));
                          uVar21 = ((long)right_most_path.
                                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_cur -
                                    (long)right_most_path.
                                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_first >> 2) + uVar26;
                          if (uVar21 < 0x80) {
                            piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_cur + uVar26;
                          }
                          else {
                            uVar23 = uVar21 >> 7 | 0xfe00000000000000;
                            if (0 < (long)uVar21) {
                              uVar23 = uVar21 >> 7;
                            }
                            piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar23] +
                                      uVar21 + uVar23 * -0x80;
                          }
                          piVar22 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_cur;
                          if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur ==
                              right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_first) {
                            piVar22 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                          }
                          _Stack_2a0._0_8_ =
                               *(undefined8 *)
                                ((edge_candidates_1.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar18 * 2)
                          ;
                          _Stack_2a0._M_parent =
                               *(_Base_ptr *)
                                ((edge_candidates_1.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar18 * 2
                                + 2);
                          _Stack_2a0._M_left =
                               *(_Base_ptr *)
                                ((edge_candidates_1.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                lVar18 * 2 + 4);
                          _Stack_2a0._M_right =
                               *(_Base_ptr *)
                                ((edge_candidates_1.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar18 * 2 + 4 + 2);
                          _Stack_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                          _Stack_280._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)0x0;
                          _Stack_280._M_impl.super__Rb_tree_header._M_header._M_left =
                               &_Stack_280._M_impl.super__Rb_tree_header._M_header;
                          _Stack_280._M_impl.super__Rb_tree_header._M_node_count = 0;
                          local_250._M_bucket_count = 1;
                          local_250._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                          local_250._M_element_count = 0;
                          local_250._M_rehash_policy._M_max_load_factor = 1.0;
                          local_250._M_rehash_policy._M_next_resize = 0;
                          local_250._M_single_bucket = (__node_base_ptr)0x0;
                          _n_1 = CONCAT44(piVar22[-1] + 1,*piVar16);
                          _Stack_280._M_impl.super__Rb_tree_header._M_header._M_right =
                               _Stack_280._M_impl.super__Rb_tree_header._M_header._M_left;
                          local_250._M_buckets = &local_250._M_single_bucket;
                          iVar15 = std::
                                   _Rb_tree<dgrminer::children_candidate,_dgrminer::children_candidate,_std::_Identity<dgrminer::children_candidate>,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                                   ::find(&__return_storage_ptr__->_M_t,(key_type *)&n_1);
                          if ((_Rb_tree_header *)iVar15._M_node == p_Var1) {
                            std::
                            _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            ::_M_insert_unique<int_const&>
                                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                        *)&_Stack_280,&g_id);
                            if (new_measures) {
                              p_Var14 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                         *)std::__detail::
                                           _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           ::operator[]((
                                                  _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&local_250,&g_id);
                              std::
                              _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                              ::
                              _M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                                        (p_Var14,(set<int,_std::less<int>,_std::allocator<int>_> *)
                                                 &n_1_1);
                            }
                            std::
                            _Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                            ::_M_insert_unique<dgrminer::children_candidate_const&>
                                      ((_Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                                        *)__return_storage_ptr__,(children_candidate *)&n_1);
                          }
                          else {
                            std::
                            _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            ::_M_insert_unique<int_const&>
                                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                        *)&iVar15._M_node[2]._M_parent,&g_id);
                            if (new_measures) {
                              p_Var14 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                         *)std::__detail::
                                           _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           ::operator[]((
                                                  _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&iVar15._M_node[3]._M_right,&g_id);
                              std::
                              _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                              ::
                              _M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                                        (p_Var14,(set<int,_std::less<int>,_std::allocator<int>_> *)
                                                 &n_1_1);
                            }
                          }
                          std::
                          _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable(&local_250);
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::~_Rb_tree(&_Stack_280);
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                       *)&n_1_1);
                          uVar19 = uVar19 + 1;
                          lVar18 = lVar18 + 4;
                        } while (uVar19 < (ulong)((long)edge_candidates_1.
                                                                                                                
                                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)edge_candidates_1.
                                                                                                                
                                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                      }
                      if (edge_candidates_1.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(edge_candidates_1.
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(real_second_edge_ids.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                      }
                      bVar9 = 0 < (long)uVar26;
                      uVar26 = uVar26 - 1;
                    } while (bVar9);
                  }
                  if (local_328 <
                      (ulong)((long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2)) {
                    real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_328] = 0;
                    real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_328] = 0;
                    real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_328] = 0;
                    real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_328] = 0;
                  }
                  if (right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(right_most_path_occurrence.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  iVar29 = local_338 + -1;
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::~_Rb_tree(&pattern_occurrence_vertexes._M_t);
                }
                if (iVar29 != 0) {
                  paVar7 = (pvVar30->
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  iVar4 = paVar7[iVar29]._M_elems[0];
                  iVar5 = paVar7[iVar29]._M_elems[1];
                  iVar6 = sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar4];
                  local_334 = iVar6;
                  if (iVar4 <= iVar5) goto LAB_00142a30;
                  uVar26 = (ulong)sequence_of_edge_indices.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar29];
                  piVar17 = adj_list.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar6].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  bVar9 = true;
                  if (uVar26 < (ulong)((long)adj_list.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish - (long)piVar17 >> 2)
                     ) {
                    iVar4 = sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar5];
                    bVar9 = true;
                    local_338 = iVar4;
                    do {
                      if (piVar17[uVar26] == local_338) {
                        local_318 = (long)iVar29;
                        local_328 = local_318 * 0x28;
                        bVar10 = is_adj_info_equal_to_pattern_edge
                                           (adj_edge_info.
                                            super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar26,
                                            (pvVar30->
                                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + local_318,
                                            true);
                        if (bVar10) {
                          bVar10 = (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start != 0;
                          if (bVar10) {
                            uVar19 = (long)real_ids_src.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                     (long)real_ids_src.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start >> 2;
                            uVar21 = 1;
                            do {
                              bVar32 = false;
                              bVar31 = false;
                              if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar21 - 1] == local_334
                                  ) && (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar21 - 1] ==
                                        local_338)) {
                                bVar31 = uVar26 == (long)real_ids_dst_ind.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [uVar21 - 1];
                                pvVar30 = local_320;
                              }
                              if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar21 - 1] == local_338
                                  ) && (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar21 - 1] ==
                                        local_334)) {
                                bVar32 = uVar26 == (long)real_ids_src_ind.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [uVar21 - 1];
                                pvVar30 = local_320;
                              }
                              if (bVar32 || bVar31) goto LAB_001429fb;
                              bVar10 = uVar21 < uVar19;
                              lVar18 = (-(ulong)(uVar19 == 0) - uVar19) + uVar21;
                              uVar21 = uVar21 + 1;
                            } while (lVar18 != 0);
                          }
                          real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_318] = local_334;
                          real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_318] = local_338;
                          real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_318] = (int)uVar26;
                          piVar17 = adj_list.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                          if (adj_list.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar4].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish != piVar17) {
                            lVar18 = 0;
                            uVar19 = 0;
                            do {
                              if (piVar17[uVar19] == local_334) {
                                flipAdjacencyInfo((array<int,_8UL> *)
                                                  ((long)(adj_edge_info.
                                                                                                                    
                                                  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar18));
                                bVar9 = is_adj_info_equal_to_pattern_edge
                                                  ((array<int,_8UL> *)&n_1,
                                                   (array<int,_10UL> *)
                                                   ((long)((local_320->
                                                                                                                      
                                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + local_328),true);
                                if (bVar9) {
                                  real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[local_318] = (int)uVar19;
                                  break;
                                }
                              }
                              uVar19 = uVar19 + 1;
                              piVar17 = adj_list.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start;
                              lVar18 = lVar18 + 0x20;
                            } while (uVar19 < (ulong)((long)adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar17 >> 2));
                          }
                          sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_318] = (int)uVar26 + 1;
                          iVar29 = (int)local_318 + 1;
                          bVar9 = false;
                          __return_storage_ptr__ =
                               (set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                                *)local_330;
                          pvVar30 = local_320;
LAB_001429fb:
                          if (!bVar10) break;
                        }
                      }
                      uVar26 = uVar26 + 1;
                      piVar17 = adj_list.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                    } while (uVar26 < (ulong)((long)adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                              (long)piVar17 >> 2));
                  }
                  if (bVar9) goto LAB_00142d15;
                  goto LAB_00141c46;
                }
                if (sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(sequence_of_edge_indices.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
                }
                if (sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < (ulong)((long)adj_list.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                      (long)adj_list.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start >> 2));
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 < (ulong)(((long)adj_list.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)adj_list.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      if (real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&adj_edge_info);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&adj_list);
      piVar13 = piVar13 + 1;
    } while (piVar13 != piVar8);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&right_most_path.super__Deque_base<int,_std::allocator<int>_>);
  return (set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
          *)(_Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
             *)__return_storage_ptr__;
LAB_00142a30:
  uVar26 = (ulong)sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar29];
  bVar9 = true;
  if (uVar26 < (ulong)((long)adj_list.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar6].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)adj_list.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar6].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2)) {
    bVar9 = true;
    do {
      lVar18 = (long)iVar29;
      local_328 = uVar26;
      local_318 = lVar18;
      bVar10 = is_adj_info_equal_to_pattern_edge
                         (adj_edge_info.
                          super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar6].
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar26,
                          (local_320->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar18,true);
      if (bVar10) {
        iVar4 = adj_list.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar6].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[local_328];
        bVar10 = (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start != 0;
        local_338 = iVar4;
        if (bVar10) {
          uVar26 = (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar19 = 1;
          do {
            bVar32 = false;
            bVar31 = false;
            if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19 - 1] == local_334) &&
               (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19 - 1] == iVar4)) {
              bVar31 = local_328 ==
                       (long)real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar19 - 1];
            }
            if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19 - 1] == iVar4) &&
               (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19 - 1] == local_334)) {
              bVar32 = local_328 ==
                       (long)real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar19 - 1];
            }
            if (bVar32 || bVar31) goto LAB_00142cb4;
            bVar10 = uVar19 < uVar26;
            lVar27 = (-(ulong)(uVar26 == 0) - uVar26) + uVar19;
            uVar19 = uVar19 + 1;
          } while (lVar27 != 0);
        }
        real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_318] = local_334;
        real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_318] = iVar4;
        real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_318] = (int)local_328;
        piVar17 = adj_list.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar4].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        if (adj_list.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar4].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
            != piVar17) {
          lVar27 = 0;
          uVar26 = 0;
          do {
            if (piVar17[uVar26] == local_334) {
              flipAdjacencyInfo((array<int,_8UL> *)
                                ((long)(adj_edge_info.
                                        super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                lVar27));
              bVar9 = is_adj_info_equal_to_pattern_edge
                                ((array<int,_8UL> *)&n_1,
                                 (local_320->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar18,true);
              if (bVar9) {
                real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[local_318] = (int)uVar26;
                break;
              }
            }
            uVar26 = uVar26 + 1;
            piVar17 = adj_list.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar4].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            lVar27 = lVar27 + 0x20;
          } while (uVar26 < (ulong)((long)adj_list.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar17 >> 2));
        }
        sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5] = local_338;
        sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_318] = (int)local_328 + 1;
        iVar29 = (int)local_318 + 1;
        bVar9 = false;
        __return_storage_ptr__ =
             (set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
              *)local_330;
LAB_00142cb4:
        pvVar30 = local_320;
        if (!bVar10) break;
      }
      uVar26 = local_328 + 1;
      pvVar30 = local_320;
    } while (uVar26 < (ulong)((long)adj_list.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)adj_list.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
  }
  if (bVar9) {
LAB_00142d15:
    sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[iVar29] = 0;
    real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar29] = 0;
    real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar29] = 0;
    real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar29] = 0;
    real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar29] = 0;
    iVar29 = iVar29 + -1;
  }
  goto LAB_00141c46;
}

Assistant:

std::set<children_candidate> enumerate(std::vector<AdjacencyListCrate> &adjacency_lists, std::vector<int> &graph_ids,
                                           std::vector<std::array<int, PAT___SIZE>> &pattern_edge_list,
                                           std::vector<std::set<int>> &nodes_occupied_by_antecedent,
                                           std::vector<std::set<int>> &edges_occupied_by_antecedent, bool new_measures,
										   std::unordered_map<int, std::set<std::set<int>>> &multiple_pattern_occurrences,
										   std::unordered_map<int, std::set<std::set<int>>> &multiple_antecedent_occurrences)
	{
        // this functions is used for finding children candidates (return value)
        // adjacency_lists - adjacency list for each graph
        // graph_ids - ids of snapshots with the pattern
        // pattern_edge_list - pattern whose children are to be searched for
        // nodes_occupied_by_antecedent - (output parameter)
        // edges_occupied_by_antecedent - (output parameter)

        // here will be the result:
		std::set<children_candidate> children_candidates;

        // right-most path used for candidate generation (similarly as in gSpan)
		std::deque<int> right_most_path = find_rightmost_path(pattern_edge_list);

		// use maximum node id as a limit of number of nodes (used later)
		int number_of_nodes_in_pattern_edge_list = 0;
		for (size_t i = 0; i < pattern_edge_list.size(); i++) {
			if (number_of_nodes_in_pattern_edge_list < pattern_edge_list[i][1]) number_of_nodes_in_pattern_edge_list = pattern_edge_list[i][1];
		}
		number_of_nodes_in_pattern_edge_list++;

		// initialize nodes_occupied_by_antecedent and edges_occupied_by_antecedent vectors
		for (int i = 0; i < adjacency_lists.size(); i++) {
			nodes_occupied_by_antecedent.push_back(std::set<int>());
			edges_occupied_by_antecedent.push_back(std::set<int>());
		}

		// find occurrences in each graph
		for (int g_id : graph_ids)
		{
            // get the adjacency list (and also edge info) for the graph currently being processed
			std::vector<std::vector<int>> adj_list = adjacency_lists[g_id].adjacencyList;
			std::vector<std::vector<std::array<int, 8>>> adj_edge_info = adjacency_lists[g_id].adjacencyEdgeInfo;

			// these two vectors save src and dst vertices (their IDs) which correspond to real occurrences of the src and dst vertices of the pattern
            // i.e. it is mapping from pattern vertex ids to vertex ids in adjacency list
			std::vector<int> real_ids_src(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_dst(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_dst_ind(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_src_ind(pattern_edge_list.size(), 0);


			int index_in_pattern_edge_list = 0;  // which element of pattern_edge_list are we currently processing

			// find occurrences in the current adj_list
            // begin by going through all edges in the adjacency list of the current graph:
			for (size_t u = 0; u < adj_list.size(); u++)
			{
				for (size_t v = 0; v < adj_list[u].size(); v++)
				{
                    // check whether the current edge in the adjacency list is equal to the current edge pattern:
					if (is_adj_info_equal_to_pattern_edge(adj_edge_info[u][v], pattern_edge_list[index_in_pattern_edge_list], true)) {
						// we found the first edge from pattern_edge_list in the adjacency list

						// which SRC and DST vertex ids (form adjacency list) were used:
						real_ids_src[0] = u;
						real_ids_dst[0] = adj_list[u][v];
                        // under which index can we find DST in the list edges going from SRC:
						real_ids_dst_ind[0] = v;
                        // and also the opposite information (under which index can we find SRC in the list of edges going from DST):
						for (size_t i = 0; i < adj_list[real_ids_dst[0]].size(); i++)
						{
							if (adj_list[real_ids_dst[0]][i] == u && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[real_ids_dst[0]][i]), pattern_edge_list[index_in_pattern_edge_list], true))
							{
								real_ids_src_ind[0] = i;
								break;
							}
						}

						// initialize the helping variables and vectors
						// here we have the real IDs of vertices 0, 1, 2, ... from the pattern (i.e. mapping of pattern vertex ID i to real vertex ID in adjacency list can be found under index i)
						std::vector<int> sequence_of_nodes(number_of_nodes_in_pattern_edge_list, 0);
						// first edge is always forward from 0 to 1:
						sequence_of_nodes[0] = u;
						sequence_of_nodes[1] = adj_list[u][v];

                        // for each edge from pattern_edge_list, we store the index of lastly processed neighbor of the relevant node (i.e. index in adj_list[src])
						// it is used for backtracking: if we backtrack we continue from that index and not from zero.
						std::vector<int> sequence_of_edge_indices(pattern_edge_list.size(), 0);
						sequence_of_edge_indices[index_in_pattern_edge_list] = v;
						index_in_pattern_edge_list++;

						// do depth first search
						while (true) {
							// if we found the occurrence of the whole pattern:
							if (index_in_pattern_edge_list >= pattern_edge_list.size())
							{
								// save antecedent nodes and edges (i.e. those that are not addition changes) to edges_occupied_by_antecedent and edges_occupied_by_antecedent
								// (used for anomalies)
								for (int i = 0; i < pattern_edge_list.size(); i++) {
									int n_1 = real_ids_src[i];
									int n_2 = real_ids_dst_ind[i];

									// all elements of the frequent pattern should be occupied
									nodes_occupied_by_antecedent[g_id].insert(n_1);
									nodes_occupied_by_antecedent[g_id].insert(real_ids_dst[i]);
									edges_occupied_by_antecedent[g_id].insert(adj_edge_info[n_1][n_2][ADJ_INFO_ID]);
								}

							  	std::set<int> pattern_occurrence_vertexes;

							  	// save pattern occurrence and antecedent occurrence in order to properly calculate new measures
							  	if (new_measures) {
								  	std::set<int> antecedent_vertexes;
								  	for (int i = 0; i < pattern_edge_list.size(); ++i) {
									  	int n_1 = real_ids_src[i];

									  	pattern_occurrence_vertexes.insert(n_1);
									  	pattern_occurrence_vertexes.insert(real_ids_dst[i]);

									  	if (pattern_edge_list[i][PAT_SRC_CHANGETIME] != 0) {
											antecedent_vertexes.insert(n_1);
										}

									  	if (pattern_edge_list[i][PAT_DST_CHANGETIME] != 0) {
											antecedent_vertexes.insert(real_ids_dst[i]);
										}
									}

								  	multiple_pattern_occurrences[g_id].insert(pattern_occurrence_vertexes);
								  	multiple_antecedent_occurrences[g_id].insert(antecedent_vertexes);
								}

								std::vector<int> right_most_path_occurrence;
								for (size_t i = 0; i < right_most_path.size(); i++)
								{
									right_most_path_occurrence.push_back(sequence_of_nodes[right_most_path[i]]);
								}

								// generate all children (i.e. generate all edges which can be appended to the base pattern(pattern_edge_list)) and their occurrence

								// first, generate the backward edges (candidates):
								int right_most_vertex = right_most_path_occurrence.back();

								int backward_starting_ind = 0;
								if (right_most_path.back() == pattern_edge_list.back()[PAT_SRC_ID] && pattern_edge_list.back()[PAT_SRC_ID] > pattern_edge_list.back()[PAT_DST_ID])
								{
									// if the last edge in edge_list is a backward edge from the current RMP, add only edges with greater code
									for (size_t i = 0; i < right_most_path.size(); i++)
									{
										if (right_most_path[i] == pattern_edge_list.back()[PAT_DST_ID])
										{
											backward_starting_ind = i;
											break;
										}
									}
								}

								for (int i = backward_starting_ind; i < right_most_path.size() - 1; i++)
								{
									std::vector<std::array<int, 8>> edge_candidates = find_backward_edge_candidates(adj_list, adj_edge_info,
										right_most_vertex, right_most_path_occurrence[i],
										real_ids_src, real_ids_dst, real_ids_dst_ind);

									// save the edge_candidates (i,j must be appended)
									for (int j = 0; j < edge_candidates.size(); j++)
									{
										// save all children candidates
										std::array<int, 10> e_cand = { right_most_path.back(), right_most_path[i],
											edge_candidates[j][0], edge_candidates[j][1], edge_candidates[j][2], edge_candidates[j][3], edge_candidates[j][4],
											edge_candidates[j][5], edge_candidates[j][6], edge_candidates[j][7] };

										children_candidate cc;
										cc.elements = e_cand;
										// does not use edge ID when searching for the edge (we care only about the edge itself and its graph ids = occurrences)
										auto it = children_candidates.find(cc);

										if (it != std::end(children_candidates))
										{
											(it->occurrences).insert(g_id);

											if (new_measures) {
											  	it->multiple_occurrences[g_id].insert(pattern_occurrence_vertexes);
											}
										}
										else {
											cc.occurrences.insert(g_id);

											if (new_measures) {
											  	cc.multiple_occurrences[g_id].insert(pattern_occurrence_vertexes);
											}

										  	children_candidates.insert(cc);
										}
									}
								}

								// forward candidates:
								for (int i = right_most_path.size() - 1; i >= 0; i--)
								{
								  	std::vector<int> real_second_edge_ids;
								  	// realne id1 right_most_path_occurrence[i]
									std::vector<std::array<int, 8>> edge_candidates = find_forward_edge_candidates(adj_list, adj_edge_info,
										right_most_path_occurrence[i], sequence_of_nodes, real_second_edge_ids);

									for (int j = 0; j < edge_candidates.size(); j++)
									{
									  	std::set<int> child_occurrence_vertexes = pattern_occurrence_vertexes;
									  	child_occurrence_vertexes.insert(right_most_path_occurrence[i]);
									  	child_occurrence_vertexes.insert(real_second_edge_ids[j]);

										std::array<int, 10> e_cand = { right_most_path[i], right_most_path.back() + 1,
											edge_candidates[j][0], edge_candidates[j][1], edge_candidates[j][2], edge_candidates[j][3], edge_candidates[j][4],
											edge_candidates[j][5], edge_candidates[j][6], edge_candidates[j][7] };


										children_candidate cc;
										cc.elements = e_cand;
										// does not use edge ID when searching for the edge (we care only about the edge itself and its graph ids = occurrences)
										auto it = children_candidates.find(cc);


										if (it != std::end(children_candidates))
										{
											(it->occurrences).insert(g_id);

											if (new_measures) {
											  	it->multiple_occurrences[g_id].insert(child_occurrence_vertexes);
											}
										}
										else
										{
											cc.occurrences.insert(g_id);

										  	if (new_measures) {
												cc.multiple_occurrences[g_id].insert(child_occurrence_vertexes);
											}

											children_candidates.insert(cc);
										}
									}
								}

								// and backtrack
								if (index_in_pattern_edge_list < real_ids_src.size())
								{
									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;

								}
								index_in_pattern_edge_list--;

							} // if (current_index_in_edge_list >= pattern_edge_list.size()) // (if we found the occurrence of the whole pattern)

							// if we backtracked down to 1, it means that we tried all possibilities from this starting point in the given adjacency list
							if (index_in_pattern_edge_list == 0)
							{
								break;
							}

							// traverse (i.e. try to match the rest of the pattern with respect to the selected starting position in adjacency list):
							// try to find the occurrence of this pattern edge:
							int i = pattern_edge_list[index_in_pattern_edge_list][0];
							int j = pattern_edge_list[index_in_pattern_edge_list][1];

                            // check whether the edge is forward or backward
							if (i > j)
							{
								// backward edge;
								// we already have both vertices (real ids from adjacency list) in sequence_of_nodes, so get them:
								int src = sequence_of_nodes[i];
								int dst = sequence_of_nodes[j];
								// find the first index of an edge from "src" to "dst" and save the index into sequence_of_edge_indices
								bool should_backtrack = true;
								for (size_t edge_ind = sequence_of_edge_indices[index_in_pattern_edge_list]; edge_ind < adj_list[src].size(); edge_ind++)
								{
									// if we found the appropriate edge (don't use edge ID for matching):
									if (adj_list[src][edge_ind] == dst && is_adj_info_equal_to_pattern_edge(adj_edge_info[src][edge_ind], pattern_edge_list[index_in_pattern_edge_list], true))
									{
										// there can be only one edge which exactly matches
										// check if that edge is already there (occupied by traversal):
										bool is_already_there = false;
										for (size_t k = 0; k < real_ids_src.size(); k++)
										{
											if ((real_ids_src[k] == src && real_ids_dst[k] == dst && real_ids_dst_ind[k] == edge_ind)
												| (real_ids_src[k] == dst && real_ids_dst[k] == src && real_ids_src_ind[k] == edge_ind))
											{
												is_already_there = true;
												break;
											}
										}

										if (!is_already_there)
										{
											should_backtrack = false;
                                            // store the positions
											real_ids_src[index_in_pattern_edge_list] = src;
											real_ids_dst[index_in_pattern_edge_list] = dst;
											real_ids_dst_ind[index_in_pattern_edge_list] = edge_ind;
											for (size_t i = 0; i < adj_list[dst].size(); i++)
											{
												if (adj_list[dst][i] == src && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[dst][i]), pattern_edge_list[index_in_pattern_edge_list], true))
												{
													real_ids_src_ind[index_in_pattern_edge_list] = i;
													break;
												}
											}

											sequence_of_edge_indices[index_in_pattern_edge_list] = edge_ind + 1;
											index_in_pattern_edge_list++;

											break;
										}

									}
								}

								if (should_backtrack)
								{

									sequence_of_edge_indices[index_in_pattern_edge_list] = 0;



									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;

									index_in_pattern_edge_list--;
								}
							}
							else
							{
								// forward edge
								// "src" vertex is already known in this case
								int src = sequence_of_nodes[i];
								// (but we must find the appropriate "dst" vertex)
								bool should_backtrack = true;
								for (size_t edge_ind = sequence_of_edge_indices[index_in_pattern_edge_list]; edge_ind < adj_list[src].size(); edge_ind++)
								{
									if (is_adj_info_equal_to_pattern_edge(adj_edge_info[src][edge_ind], pattern_edge_list[index_in_pattern_edge_list], true))
									{
										int dst = adj_list[src][edge_ind];
										// check if that edge is already there:
										bool is_already_there = false;
										for (size_t k = 0; k < real_ids_src.size(); k++)
										{
											if ((real_ids_src[k] == src && real_ids_dst[k] == dst && real_ids_dst_ind[k] == edge_ind)
												| (real_ids_src[k] == dst && real_ids_dst[k] == src && real_ids_src_ind[k] == edge_ind))
											{
												is_already_there = true;
												break;
											}
										}
										if (!is_already_there)
										{
											should_backtrack = false;
											real_ids_src[index_in_pattern_edge_list] = src;
											real_ids_dst[index_in_pattern_edge_list] = dst;
											real_ids_dst_ind[index_in_pattern_edge_list] = edge_ind;

											for (size_t i = 0; i < adj_list[dst].size(); i++)
											{
												if (adj_list[dst][i] == src && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[dst][i]), pattern_edge_list[index_in_pattern_edge_list], true))
												{
													real_ids_src_ind[index_in_pattern_edge_list] = i;
													break;
												}
											}

											sequence_of_nodes[j] = dst;
											sequence_of_edge_indices[index_in_pattern_edge_list] = edge_ind + 1;
											index_in_pattern_edge_list++;

											break;
										}
									}

								}

								if (should_backtrack)
								{
									sequence_of_edge_indices[index_in_pattern_edge_list] = 0;
									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;
									index_in_pattern_edge_list--;
								}
							}

						}

					} // if (is_adj_info_equal_to_pattern_edge(adj_edge_info[u][v], pattern_edge_list[current_index_in_edge_list], true))

				} // for (size_t v = 0; v < adj_list[u].size(); v++)
			} // for (size_t u = 0; u < adj_list.size(); u++)

		} // for (int g_id : graph_ids)

		return children_candidates;
	}